

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::glTFImporter::CanRead(glTFImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  bool bVar2;
  string version;
  Asset asset;
  char *local_7d8;
  long local_7d0;
  char local_7c8 [16];
  string local_7b8;
  Asset local_798;
  
  BaseImporter::GetExtension(&local_7b8,pFile);
  iVar1 = std::__cxx11::string::compare((char *)&local_7b8);
  if (iVar1 == 0) {
    if (pIOHandler == (IOSystem *)0x0) {
      bVar2 = false;
      goto LAB_006574c0;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_7b8);
    bVar2 = false;
    if ((pIOHandler == (IOSystem *)0x0) || (iVar1 != 0)) goto LAB_006574c0;
  }
  glTF::Asset::Asset(&local_798,pIOHandler);
  iVar1 = std::__cxx11::string::compare((char *)&local_7b8);
  glTF::Asset::Load(&local_798,pFile,iVar1 == 0);
  local_7d8 = local_7c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7d8,local_798.asset.version._M_dataplus._M_p,
             local_798.asset.version._M_dataplus._M_p + local_798.asset.version._M_string_length);
  if (local_7d0 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = *local_7d8 == '1';
  }
  if (local_7d8 != local_7c8) {
    operator_delete(local_7d8);
  }
  glTF::Asset::~Asset(&local_798);
LAB_006574c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool glTFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const {
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb") {
        return false;
    }

    if (pIOHandler) {
        glTF::Asset asset(pIOHandler);
        try {
            asset.Load(pFile, extension == "glb");
            std::string version = asset.asset.version;
            return !version.empty() && version[0] == '1';
        } catch (...) {
            return false;
        }
    }

    return false;
}